

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O3

string * __thiscall
m2d::savanna::endpoint::scheme_abi_cxx11_(string *__return_storage_ptr__,endpoint *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,url_scheme::https_abi_cxx11_,
             DAT_00219a40 + url_scheme::https_abi_cxx11_);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string scheme()
		{
			return url_scheme::https;
		}